

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common_list.c
# Opt level: O0

void test_conditions(void)

{
  bool local_74;
  bool local_73;
  bool local_72;
  
  cunit_start_test("test_conditions");
  head.prev = &head;
  head.next = &head;
  cunit_named_check(true,"test_conditions",0xb3,"list_is_empty (1)");
  local_72 = elements1[0].node.next != (list_entity *)0x0 &&
             elements1[0].node.prev != (list_entity *)0x0;
  cunit_named_check((_Bool)((local_72 ^ 0xffU) & 1),"test_conditions",0xb4,"list_node_added (1)");
  add_elements(elements1,false);
  local_73 = head.next == &head && head.prev == &head;
  cunit_named_check((_Bool)((local_73 ^ 0xffU) & 1),"test_conditions",0xb8,"list_is_empty (1)");
  local_74 = elements1[0].node.next != (list_entity *)0x0 &&
             elements1[0].node.prev != (list_entity *)0x0;
  cunit_named_check(local_74,"test_conditions",0xb9,"list_node_added (1)");
  cunit_named_check(head.next == &elements1[0].node,"test_conditions",0xbb,"list_is_first (1)");
  cunit_named_check(head.prev == &elements1[5].node,"test_conditions",0xbc,"list_is_last (1)");
  cunit_named_check((_Bool)((head.next == &elements1[1].node ^ 0xffU) & 1),"test_conditions",0xbd,
                    "list_is_first (2)");
  cunit_named_check((_Bool)((head.prev == &elements1[1].node ^ 0xffU) & 1),"test_conditions",0xbe,
                    "list_is_last (2)");
  cunit_end_test("test_conditions");
  return;
}

Assistant:

static void test_conditions(void) {
  START_TEST();
  list_init_head(&head);

  CHECK_TRUE(list_is_empty(&head), "list_is_empty (1)");
  CHECK_TRUE(!list_is_node_added(&elements1[0].node), "list_node_added (1)");

  add_elements(elements1, false);

  CHECK_TRUE(!list_is_empty(&head), "list_is_empty (1)");
  CHECK_TRUE(list_is_node_added(&elements1[0].node), "list_node_added (1)");

  CHECK_TRUE(list_is_first(&head, &elements1[0].node), "list_is_first (1)");
  CHECK_TRUE(list_is_last(&head, &elements1[COUNT-1].node), "list_is_last (1)");
  CHECK_TRUE(!list_is_first(&head, &elements1[1].node), "list_is_first (2)");
  CHECK_TRUE(!list_is_last(&head, &elements1[1].node), "list_is_last (2)");
  END_TEST();
}